

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_json_schema.cpp
# Opt level: O2

string * __thiscall
flatbuffers::jsons::JsonSchemaGenerator::PrepareDescription
          (string *__return_storage_ptr__,JsonSchemaGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *comment_lines)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  pointer pbVar4;
  allocator<char> local_89;
  string description;
  pointer local_60;
  pointer local_58;
  string comment;
  
  comment._M_dataplus._M_p = (pointer)&comment.field_2;
  comment._M_string_length = 0;
  comment.field_2._M_local_buf[0] = '\0';
  pbVar4 = (comment_lines->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  while (pbVar4 != (comment_lines->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish) {
    pcVar2 = (pbVar4->_M_dataplus)._M_p;
    __first = std::
              __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<flatbuffers::jsons::JsonSchemaGenerator::PrepareDescription(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::_lambda(char)_1_>>
                        (pcVar2,pcVar2 + pbVar4->_M_string_length);
    local_60 = (pbVar4->_M_dataplus)._M_p;
    local_58 = local_60 + pbVar4->_M_string_length;
    std::
    find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,flatbuffers::jsons::JsonSchemaGenerator::PrepareDescription(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::_lambda(char)_2_>
              (&description,&local_58,&local_60);
    if (__first._M_current < description._M_dataplus._M_p) {
      std::__cxx11::string::
      append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((string *)&comment,__first,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )description._M_dataplus._M_p);
    }
    else {
      std::__cxx11::string::append((string *)&comment);
    }
    pbVar4 = pbVar4 + 1;
    if (pbVar4 != (comment_lines->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::append((char *)&comment);
    }
  }
  if (comment._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&description);
  }
  else {
    paVar1 = &description.field_2;
    description._M_string_length = 0;
    description.field_2._M_local_buf[0] = '\0';
    description._M_dataplus._M_p = (pointer)paVar1;
    bVar3 = EscapeString(comment._M_dataplus._M_p,comment._M_string_length,&description,true,true);
    if (bVar3) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)description._M_dataplus._M_p == paVar1) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(description.field_2._M_allocated_capacity._1_7_,
                      description.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = description.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = description._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(description.field_2._M_allocated_capacity._1_7_,
                      description.field_2._M_local_buf[0]);
      }
      __return_storage_ptr__->_M_string_length = description._M_string_length;
      description._M_string_length = 0;
      description.field_2._M_local_buf[0] = '\0';
      description._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_89);
    }
    std::__cxx11::string::~string((string *)&description);
  }
  std::__cxx11::string::~string((string *)&comment);
  return __return_storage_ptr__;
}

Assistant:

std::string PrepareDescription(
      const std::vector<std::string> &comment_lines) {
    std::string comment;
    for (auto line_iterator = comment_lines.cbegin();
         line_iterator != comment_lines.cend(); ++line_iterator) {
      const auto &comment_line = *line_iterator;

      // remove leading and trailing spaces from comment line
      const auto start = std::find_if(comment_line.begin(), comment_line.end(),
                                      [](char c) { return !isspace(c); });
      const auto end =
          std::find_if(comment_line.rbegin(), comment_line.rend(), [](char c) {
            return !isspace(c);
          }).base();
      if (start < end) {
        comment.append(start, end);
      } else {
        comment.append(comment_line);
      }

      if (line_iterator + 1 != comment_lines.cend()) comment.append("\n");
    }
    if (!comment.empty()) {
      std::string description;
      if (EscapeString(comment.c_str(), comment.length(), &description, true,
                       true)) {
        return description;
      }
      return "";
    }
    return "";
  }